

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O2

char * rsa_ssh1_fingerprint(RSAKey *key)

{
  uint8_t uVar1;
  ssh_hash *h;
  size_t sVar2;
  strbuf *buf_o;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  BinarySink *pBVar6;
  uchar digest [16];
  byte local_48 [24];
  
  h = ssh_hash_new(&ssh_md5);
  sVar2 = mp_get_nbits(key->modulus);
  uVar5 = sVar2 + 7 >> 3;
  while (uVar5 = uVar5 - 1, uVar5 != 0xffffffffffffffff) {
    pBVar6 = h->binarysink_;
    uVar1 = mp_get_byte(key->modulus,uVar5);
    BinarySink_put_byte(pBVar6,uVar1);
  }
  sVar2 = mp_get_nbits(key->exponent);
  uVar5 = sVar2 + 7 >> 3;
  while (uVar5 = uVar5 - 1, uVar5 != 0xffffffffffffffff) {
    pBVar6 = h->binarysink_;
    uVar1 = mp_get_byte(key->exponent,uVar5);
    BinarySink_put_byte(pBVar6,uVar1);
  }
  ssh_hash_final(h,local_48);
  buf_o = strbuf_new();
  pBVar6 = buf_o->binarysink_;
  sVar2 = mp_get_nbits(key->modulus);
  BinarySink_put_fmt(pBVar6,"%zu ",sVar2);
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
    pcVar3 = ":";
    if (lVar4 == 0) {
      pcVar3 = "";
    }
    BinarySink_put_fmt(pBVar6,"%s%02x",pcVar3,(ulong)local_48[lVar4]);
  }
  if (key->comment != (char *)0x0) {
    BinarySink_put_fmt(pBVar6," %s");
  }
  pcVar3 = strbuf_to_str(buf_o);
  return pcVar3;
}

Assistant:

char *rsa_ssh1_fingerprint(RSAKey *key)
{
    unsigned char digest[16];
    strbuf *out;
    int i;

    /*
     * The hash preimage for SSH-1 key fingerprinting consists of the
     * modulus and exponent _without_ any preceding length field -
     * just the minimum number of bytes to represent each integer,
     * stored big-endian, concatenated with no marker at the division
     * between them.
     */

    ssh_hash *hash = ssh_hash_new(&ssh_md5);
    for (size_t i = (mp_get_nbits(key->modulus) + 7) / 8; i-- > 0 ;)
        put_byte(hash, mp_get_byte(key->modulus, i));
    for (size_t i = (mp_get_nbits(key->exponent) + 7) / 8; i-- > 0 ;)
        put_byte(hash, mp_get_byte(key->exponent, i));
    ssh_hash_final(hash, digest);

    out = strbuf_new();
    put_fmt(out, "%"SIZEu" ", mp_get_nbits(key->modulus));
    for (i = 0; i < 16; i++)
        put_fmt(out, "%s%02x", i ? ":" : "", digest[i]);
    if (key->comment)
        put_fmt(out, " %s", key->comment);
    return strbuf_to_str(out);
}